

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptString::DeleteProperty
          (JavascriptString *this,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  char16 *varName;
  PropertyOperationFlags propertyOperationFlags_local;
  PropertyId propertyId_local;
  JavascriptString *this_local;
  
  if (propertyId == 0xd1) {
    scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    this_00 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    this_01 = ScriptContext::GetPropertyName(this_00,0xd1);
    varName = PropertyRecord::GetBuffer(this_01);
    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,scriptContext,varName);
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         RecyclableObject::DeleteProperty
                   (&this->super_RecyclableObject,propertyId,propertyOperationFlags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptString::DeleteProperty(PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if (propertyId == PropertyIds::length)
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());

            return FALSE;
        }
        return __super::DeleteProperty(propertyId, propertyOperationFlags);
    }